

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O3

void aom_highbd_quantize_b_64x64_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  uint *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  bool bVar37;
  bool bVar38;
  int iVar39;
  ulong uVar40;
  short *psVar41;
  long lVar42;
  int *piVar43;
  int *piVar44;
  ushort uVar45;
  uint uVar46;
  ushort uVar49;
  ushort uVar50;
  uint uVar51;
  ushort uVar52;
  ushort uVar53;
  uint uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  uint uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar85;
  uint uVar93;
  uint uVar94;
  uint uVar95;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar96;
  int iVar102;
  int iVar103;
  int iVar104;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  uint uVar136;
  uint uVar137;
  undefined1 auVar129 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  uint uVar138;
  uint uVar139;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  undefined1 auVar140 [16];
  uint uVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  uint uVar148;
  int iVar149;
  int iVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  int iVar153;
  int iVar156;
  int iVar157;
  int iVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar159;
  uint uVar164;
  uint uVar165;
  undefined1 auVar160 [16];
  uint uVar166;
  uint uVar167;
  undefined1 auVar163 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  __m128i sign_lo;
  undefined1 local_178 [16];
  int local_168;
  int aiStack_164 [5];
  undefined8 local_150;
  int thresh [4];
  __m128i sign_hi_4;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar141 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  
  auVar47 = pshuflw(ZEXT416(*(uint *)zbin_ptr),ZEXT416(*(uint *)zbin_ptr),0x60);
  local_150 = CONCAT44((auVar47._4_4_ >> 0x10) + 2 >> 2,(auVar47._0_4_ >> 0x10) + 2 >> 2);
  lVar42 = 0;
  piVar43 = &local_168;
  piVar44 = (int *)&local_150;
  bVar37 = true;
  do {
    bVar38 = bVar37;
    *piVar43 = (dequant_ptr[lVar42] * 0x145 + 0x40 >> 7) + *piVar44 * 0x20 + -1;
    lVar42 = 1;
    piVar43 = aiStack_164;
    piVar44 = (int *)((long)&local_150 + 4);
    bVar37 = false;
  } while (bVar38);
  auVar47 = *(undefined1 (*) [16])zbin_ptr;
  auVar76 = *(undefined1 (*) [16])round_ptr;
  auVar174 = *(undefined1 (*) [16])quant_ptr;
  auVar64 = *(undefined1 (*) [16])dequant_ptr;
  auVar106 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar48 = psraw(auVar47,0xf);
  auVar75 = psraw(auVar76,0xf);
  auVar173._0_12_ = auVar47._0_12_;
  auVar173._12_2_ = auVar47._6_2_;
  auVar173._14_2_ = auVar48._6_2_;
  auVar141._12_4_ = auVar173._12_4_;
  auVar141._0_10_ = auVar47._0_10_;
  auVar141._10_2_ = auVar48._4_2_;
  auVar140._10_6_ = auVar141._10_6_;
  auVar140._0_8_ = auVar47._0_8_;
  auVar140._8_2_ = auVar47._4_2_;
  auVar32._4_8_ = auVar140._8_8_;
  auVar32._2_2_ = auVar48._2_2_;
  auVar32._0_2_ = auVar47._2_2_;
  auVar162._0_12_ = auVar76._0_12_;
  auVar162._12_2_ = auVar76._6_2_;
  auVar162._14_2_ = auVar75._6_2_;
  auVar161._12_4_ = auVar162._12_4_;
  auVar161._0_10_ = auVar76._0_10_;
  auVar161._10_2_ = auVar75._4_2_;
  auVar160._10_6_ = auVar161._10_6_;
  auVar160._0_8_ = auVar76._0_8_;
  auVar160._8_2_ = auVar76._4_2_;
  auVar33._4_8_ = auVar160._8_8_;
  auVar33._2_2_ = auVar75._2_2_;
  auVar33._0_2_ = auVar76._2_2_;
  uVar145 = auVar140._8_4_ + 2U >> 2;
  uVar147 = auVar141._12_4_ + 2U >> 2;
  auVar168._8_4_ = 0xffffffff;
  auVar168._0_8_ = 0xffffffffffffffff;
  auVar168._12_4_ = 0xffffffff;
  iVar149 = uVar145 - 1;
  iVar150 = uVar147 - 1;
  uVar85 = *coeff_ptr >> 0x1f;
  uVar93 = coeff_ptr[1] >> 0x1f;
  uVar94 = coeff_ptr[2] >> 0x1f;
  uVar95 = coeff_ptr[3] >> 0x1f;
  uVar46 = coeff_ptr[4] >> 0x1f;
  uVar51 = coeff_ptr[5] >> 0x1f;
  uVar54 = coeff_ptr[6] >> 0x1f;
  uVar57 = coeff_ptr[7] >> 0x1f;
  iVar153 = (*coeff_ptr ^ uVar85) - uVar85;
  iVar156 = (coeff_ptr[1] ^ uVar93) - uVar93;
  iVar157 = (coeff_ptr[2] ^ uVar94) - uVar94;
  iVar158 = (coeff_ptr[3] ^ uVar95) - uVar95;
  iVar96 = (coeff_ptr[4] ^ uVar46) - uVar46;
  iVar102 = (coeff_ptr[5] ^ uVar51) - uVar51;
  iVar103 = (coeff_ptr[6] ^ uVar54) - uVar54;
  iVar104 = (coeff_ptr[7] ^ uVar57) - uVar57;
  auVar105._0_4_ = -(uint)(local_168 < iVar153 * 0x20);
  auVar105._4_4_ = -(uint)(aiStack_164[0] < iVar156 * 0x20);
  auVar105._8_4_ = -(uint)(aiStack_164[0] < iVar157 * 0x20);
  auVar105._12_4_ = -(uint)(aiStack_164[0] < iVar158 * 0x20);
  auVar120._0_4_ = -(uint)(aiStack_164[0] < iVar96 * 0x20);
  auVar120._4_4_ = -(uint)(aiStack_164[0] < iVar102 * 0x20);
  auVar120._8_4_ = -(uint)(aiStack_164[0] < iVar103 * 0x20);
  auVar120._12_4_ = -(uint)(aiStack_164[0] < iVar104 * 0x20);
  auVar105 = packssdw(auVar105,auVar120);
  local_178 = (undefined1  [16])0x0;
  bVar23 = (auVar105 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar105 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar105 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar105 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar105 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar105 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar105 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar105 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar105 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar105 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar105 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar105 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar105 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar11 = (auVar105 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar38 = (auVar105 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = auVar105[0xf] < '\0';
  if (((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
             bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar38) ||
      bVar37) {
    local_178 = auVar105 & *(undefined1 (*) [16])iscan;
  }
  bVar37 = ((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                  bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) ||
           bVar38) || bVar37;
  auVar173 = psraw(auVar174,0xf);
  auVar120 = psraw(auVar64,0xf);
  auVar105 = psraw(auVar106,0xf);
  auVar48._0_4_ = -(uint)(iVar153 < (int)(CONCAT22(auVar48._0_2_,auVar47._0_2_) + 2U >> 2));
  auVar48._4_4_ = -(uint)(iVar156 < (int)(auVar32._0_4_ + 2U >> 2));
  auVar48._8_4_ = -(uint)(iVar157 < (int)uVar145);
  auVar48._12_4_ = -(uint)(iVar158 < (int)uVar147);
  auVar151._0_4_ = -(uint)(iVar149 < iVar96);
  auVar151._4_4_ = -(uint)(iVar150 < iVar102);
  auVar151._8_4_ = -(uint)(iVar149 < iVar103);
  auVar151._12_4_ = -(uint)(iVar150 < iVar104);
  auVar47 = packssdw(auVar168 ^ auVar48,auVar151);
  uVar49 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar47[0xf] >> 7) << 0xf
  ;
  if (uVar49 == 0) {
    auVar47 = (undefined1  [16])0x0;
  }
  else {
    auVar47 = auVar47 & *(undefined1 (*) [16])iscan;
  }
  bVar38 = uVar49 != 0;
  auVar62._0_12_ = auVar174._0_12_;
  auVar62._12_2_ = auVar174._6_2_;
  auVar62._14_2_ = auVar173._6_2_;
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._0_10_ = auVar174._0_10_;
  auVar61._10_2_ = auVar173._4_2_;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._0_8_ = auVar174._0_8_;
  auVar60._8_2_ = auVar174._4_2_;
  auVar34._4_8_ = auVar60._8_8_;
  auVar34._2_2_ = auVar173._2_2_;
  auVar34._0_2_ = auVar174._2_2_;
  auVar174._2_2_ = auVar173._0_2_;
  auVar174._4_12_ = auVar34;
  auVar79._0_12_ = auVar64._0_12_;
  auVar79._12_2_ = auVar64._6_2_;
  auVar79._14_2_ = auVar120._6_2_;
  auVar78._12_4_ = auVar79._12_4_;
  auVar78._0_10_ = auVar64._0_10_;
  auVar78._10_2_ = auVar120._4_2_;
  auVar77._10_6_ = auVar78._10_6_;
  auVar77._0_8_ = auVar64._0_8_;
  auVar77._8_2_ = auVar64._4_2_;
  auVar35._4_8_ = auVar77._8_8_;
  auVar35._2_2_ = auVar120._2_2_;
  auVar35._0_2_ = auVar64._2_2_;
  auVar112._0_2_ = auVar64._0_2_;
  auVar112._2_2_ = auVar120._0_2_;
  auVar112._4_12_ = auVar35;
  auVar131._0_12_ = auVar106._0_12_;
  auVar131._12_2_ = auVar106._6_2_;
  auVar131._14_2_ = auVar105._6_2_;
  auVar130._12_4_ = auVar131._12_4_;
  auVar130._0_10_ = auVar106._0_10_;
  auVar130._10_2_ = auVar105._4_2_;
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_8_ = auVar106._0_8_;
  auVar129._8_2_ = auVar106._4_2_;
  auVar36._4_8_ = auVar129._8_8_;
  auVar36._2_2_ = auVar105._2_2_;
  auVar36._0_2_ = auVar106._2_2_;
  auVar170._0_2_ = auVar106._0_2_;
  auVar170._2_2_ = auVar105._0_2_;
  auVar170._4_12_ = auVar36;
  uVar165 = auVar160._8_4_ + 2U >> 2;
  uVar166 = auVar161._12_4_ + 2U >> 2;
  iVar39 = movmskps((uint)uVar49,auVar168 ^ auVar48 | auVar151);
  uVar145 = auVar60._8_4_;
  uVar147 = auVar129._8_4_;
  uVar136 = auVar77._8_4_;
  auVar106._8_4_ = (int)uVar145 >> 0x1f;
  auVar106._12_4_ = (int)auVar61._12_4_ >> 0x1f;
  auVar108._8_4_ = (int)uVar147 >> 0x1f;
  auVar108._12_4_ = (int)auVar130._12_4_ >> 0x1f;
  auVar64._8_4_ = (int)uVar136 >> 0x1f;
  auVar64._12_4_ = (int)auVar78._12_4_ >> 0x1f;
  if (iVar39 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    iVar96 = 0;
    iVar102 = 0;
    iVar103 = 0;
    iVar104 = 0;
  }
  else {
    auVar154._0_4_ = iVar153 + (CONCAT22(auVar75._0_2_,auVar76._0_2_) + 2U >> 2);
    auVar154._4_4_ = iVar156 + (auVar33._0_4_ + 2U >> 2);
    auVar154._8_4_ = iVar157 + uVar165;
    auVar154._12_4_ = iVar158 + uVar166;
    auVar106._0_4_ = (int)auVar173._0_2_ >> 0xf;
    auVar106._4_4_ = auVar34._0_4_ >> 0x1f;
    auVar121._0_8_ = CONCAT44(auVar106._0_4_,auVar106._0_4_);
    auVar121._8_4_ = auVar106._4_4_;
    auVar121._12_4_ = auVar106._4_4_;
    auVar169._0_8_ = CONCAT44(auVar106._8_4_,auVar106._8_4_);
    auVar169._8_4_ = auVar106._12_4_;
    auVar169._12_4_ = auVar106._12_4_;
    auVar174 = auVar174 ^ auVar106;
    auVar175._0_4_ = auVar174._0_4_ - auVar106._0_4_;
    auVar175._4_4_ = auVar174._4_4_ - auVar106._4_4_;
    auVar175._8_4_ = auVar174._8_4_ - auVar106._8_4_;
    auVar175._12_4_ = auVar174._12_4_ - auVar106._12_4_;
    auVar107._0_8_ = (ulong)auVar154._0_4_ * (ulong)auVar175._0_4_;
    auVar107._8_8_ = (auVar154._8_8_ & 0xffffffff) * (ulong)auVar175._8_4_;
    auVar176._0_8_ = (ulong)auVar175._4_4_ * (ulong)auVar154._4_4_;
    auVar176._8_8_ = (auVar175._8_8_ >> 0x20) * (auVar154._8_8_ >> 0x20);
    auVar80._0_4_ =
         (int)((ulong)(SUB168(auVar107 ^ auVar121,0) - auVar121._0_8_) >> 0x10) + auVar154._0_4_;
    auVar80._4_4_ =
         (int)((ulong)(SUB168(auVar176 ^ auVar169,0) - auVar169._0_8_) >> 0x10) + auVar154._4_4_;
    auVar80._8_4_ =
         (int)((ulong)(SUB168(auVar107 ^ auVar121,8) - auVar121._8_8_) >> 0x10) + auVar154._8_4_;
    auVar80._12_4_ =
         (int)((ulong)(SUB168(auVar176 ^ auVar169,8) - auVar169._8_8_) >> 0x10) + auVar154._12_4_;
    auVar108._0_4_ = (int)auVar105._0_2_ >> 0xf;
    auVar108._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar122._0_8_ = CONCAT44(auVar108._0_4_,auVar108._0_4_);
    auVar122._8_4_ = auVar108._4_4_;
    auVar122._12_4_ = auVar108._4_4_;
    auVar155._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar155._8_4_ = auVar108._12_4_;
    auVar155._12_4_ = auVar108._12_4_;
    auVar170 = auVar170 ^ auVar108;
    auVar171._0_4_ = auVar170._0_4_ - auVar108._0_4_;
    auVar171._4_4_ = auVar170._4_4_ - auVar108._4_4_;
    auVar171._8_4_ = auVar170._8_4_ - auVar108._8_4_;
    auVar171._12_4_ = auVar170._12_4_ - auVar108._12_4_;
    auVar109._0_8_ = (ulong)auVar80._0_4_ * (ulong)auVar171._0_4_;
    auVar109._8_8_ = (auVar80._8_8_ & 0xffffffff) * (ulong)auVar171._8_4_;
    auVar172._0_8_ = (ulong)auVar171._4_4_ * (ulong)auVar80._4_4_;
    auVar172._8_8_ = (auVar171._8_8_ >> 0x20) * (auVar80._8_8_ >> 0x20);
    auVar97._0_4_ = iVar96 + uVar165;
    auVar97._4_4_ = iVar102 + uVar166;
    auVar97._8_4_ = iVar103 + uVar165;
    auVar97._12_4_ = iVar104 + uVar166;
    auVar110._0_8_ = CONCAT44(auVar106._8_4_,auVar106._8_4_);
    auVar110._8_4_ = auVar106._12_4_;
    auVar110._12_4_ = auVar106._12_4_;
    auVar123._0_8_ = CONCAT44(auVar106._8_4_,auVar106._8_4_);
    auVar123._8_4_ = auVar106._12_4_;
    auVar123._12_4_ = auVar106._12_4_;
    auVar132._0_4_ = (uVar145 ^ auVar106._8_4_) - auVar106._8_4_;
    auVar132._4_4_ = (auVar61._12_4_ ^ auVar106._12_4_) - auVar106._12_4_;
    auVar132._8_4_ = (uVar145 ^ auVar106._8_4_) - auVar106._8_4_;
    auVar132._12_4_ = (auVar61._12_4_ ^ auVar106._12_4_) - auVar106._12_4_;
    auVar76._0_8_ = (ulong)auVar97._0_4_ * (ulong)auVar132._0_4_;
    auVar76._8_8_ = (auVar97._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_;
    auVar133._0_8_ = (ulong)auVar132._4_4_ * (ulong)auVar97._4_4_;
    auVar133._8_8_ = (auVar132._8_8_ >> 0x20) * (auVar97._8_8_ >> 0x20);
    auVar75._0_4_ =
         (int)((ulong)(SUB168(auVar76 ^ auVar110,0) - auVar110._0_8_) >> 0x10) + auVar97._0_4_;
    auVar75._4_4_ =
         (int)((ulong)(SUB168(auVar133 ^ auVar123,0) - auVar123._0_8_) >> 0x10) + auVar97._4_4_;
    auVar75._8_4_ =
         (int)((ulong)(SUB168(auVar76 ^ auVar110,8) - auVar110._8_8_) >> 0x10) + auVar97._8_4_;
    auVar75._12_4_ =
         (int)((ulong)(SUB168(auVar133 ^ auVar123,8) - auVar123._8_8_) >> 0x10) + auVar97._12_4_;
    auVar111._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar111._8_4_ = auVar108._12_4_;
    auVar111._12_4_ = auVar108._12_4_;
    auVar124._0_8_ = CONCAT44(auVar108._8_4_,auVar108._8_4_);
    auVar124._8_4_ = auVar108._12_4_;
    auVar124._12_4_ = auVar108._12_4_;
    auVar134._0_4_ = (uVar147 ^ auVar108._8_4_) - auVar108._8_4_;
    auVar134._4_4_ = (auVar130._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    auVar134._8_4_ = (uVar147 ^ auVar108._8_4_) - auVar108._8_4_;
    auVar134._12_4_ = (auVar130._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    auVar98._0_8_ = (ulong)auVar75._0_4_ * (ulong)auVar134._0_4_;
    auVar98._8_8_ = (auVar75._8_8_ & 0xffffffff) * (ulong)auVar134._8_4_;
    auVar135._0_8_ = (ulong)auVar134._4_4_ * (ulong)auVar75._4_4_;
    auVar135._8_8_ = (auVar134._8_8_ >> 0x20) * (auVar75._8_8_ >> 0x20);
    auVar142._0_4_ =
         ((uint)((ulong)(SUB168(auVar109 ^ auVar122,0) - auVar122._0_8_) >> 0xe) ^ uVar85) - uVar85;
    auVar142._4_4_ =
         ((uint)((ulong)((SUB168(auVar172 ^ auVar155,0) - auVar155._0_8_) * 0x40000) >> 0x20) ^
         uVar93) - uVar93;
    auVar142._8_4_ =
         ((uint)((ulong)(SUB168(auVar109 ^ auVar122,8) - auVar122._8_8_) >> 0xe) ^ uVar94) - uVar94;
    auVar142._12_4_ =
         ((uint)((ulong)((SUB168(auVar172 ^ auVar155,8) - auVar155._8_8_) * 0x40000) >> 0x20) ^
         uVar95) - uVar95;
    auVar63._0_4_ =
         ((uint)((ulong)(SUB168(auVar98 ^ auVar111,0) - auVar111._0_8_) >> 0xe) ^ uVar46) - uVar46;
    auVar63._4_4_ =
         ((uint)((ulong)((SUB168(auVar135 ^ auVar124,0) - auVar124._0_8_) * 0x40000) >> 0x20) ^
         uVar51) - uVar51;
    auVar63._8_4_ =
         ((uint)((ulong)(SUB168(auVar98 ^ auVar111,8) - auVar111._8_8_) >> 0xe) ^ uVar54) - uVar54;
    auVar63._12_4_ =
         ((uint)((ulong)((SUB168(auVar135 ^ auVar124,8) - auVar124._8_8_) * 0x40000) >> 0x20) ^
         uVar57) - uVar57;
    auVar142 = ~auVar48 & auVar142;
    auVar151 = auVar151 & auVar63;
    *(undefined1 (*) [16])qcoeff_ptr = auVar142;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar151;
    auVar81._0_4_ = auVar142._0_4_ >> 0x1f;
    auVar81._4_4_ = auVar142._4_4_ >> 0x1f;
    auVar81._8_4_ = auVar142._8_4_ >> 0x1f;
    auVar81._12_4_ = auVar142._12_4_ >> 0x1f;
    auVar142 = auVar142 ^ auVar81;
    auVar143._0_4_ = auVar142._0_4_ - auVar81._0_4_;
    auVar143._4_4_ = auVar142._4_4_ - auVar81._4_4_;
    auVar143._8_4_ = auVar142._8_4_ - auVar81._8_4_;
    auVar143._12_4_ = auVar142._12_4_ - auVar81._12_4_;
    auVar64._0_4_ = (int)auVar120._0_2_ >> 0xf;
    auVar64._4_4_ = auVar35._0_4_ >> 0x1f;
    auVar86._0_8_ = CONCAT44(auVar64._0_4_,auVar64._0_4_);
    auVar86._8_4_ = auVar64._4_4_;
    auVar86._12_4_ = auVar64._4_4_;
    auVar99._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar99._8_4_ = auVar64._12_4_;
    auVar99._12_4_ = auVar64._12_4_;
    auVar112 = auVar112 ^ auVar64;
    auVar113._0_4_ = auVar112._0_4_ - auVar64._0_4_;
    auVar113._4_4_ = auVar112._4_4_ - auVar64._4_4_;
    auVar113._8_4_ = auVar112._8_4_ - auVar64._8_4_;
    auVar113._12_4_ = auVar112._12_4_ - auVar64._12_4_;
    auVar65._0_8_ = (ulong)auVar143._0_4_ * (ulong)auVar113._0_4_;
    auVar65._8_8_ = (auVar143._8_8_ & 0xffffffff) * (ulong)auVar113._8_4_;
    auVar114._0_8_ = (ulong)auVar113._4_4_ * (ulong)auVar143._4_4_;
    auVar114._8_8_ = (auVar113._8_8_ >> 0x20) * (auVar143._8_8_ >> 0x20);
    auVar67._0_4_ = (undefined4)((ulong)(SUB168(auVar65 ^ auVar86,0) - auVar86._0_8_) >> 2);
    auVar66._8_4_ = (undefined4)((ulong)(SUB168(auVar65 ^ auVar86,8) - auVar86._8_8_) >> 2);
    auVar66._4_4_ = auVar66._8_4_;
    auVar66._0_4_ = auVar67._0_4_;
    auVar66._12_4_ =
         (int)((ulong)((SUB168(auVar114 ^ auVar99,8) - auVar99._8_8_) * 0x40000000) >> 0x20);
    auVar67._8_8_ = auVar66._8_8_;
    auVar67._4_4_ =
         (int)((ulong)((SUB168(auVar114 ^ auVar99,0) - auVar99._0_8_) * 0x40000000) >> 0x20);
    auVar67 = auVar67 ^ auVar81;
    auVar82._0_4_ = auVar151._0_4_ >> 0x1f;
    auVar82._4_4_ = auVar151._4_4_ >> 0x1f;
    auVar82._8_4_ = auVar151._8_4_ >> 0x1f;
    auVar82._12_4_ = auVar151._12_4_ >> 0x1f;
    auVar151 = auVar151 ^ auVar82;
    auVar152._0_4_ = auVar151._0_4_ - auVar82._0_4_;
    auVar152._4_4_ = auVar151._4_4_ - auVar82._4_4_;
    auVar152._8_4_ = auVar151._8_4_ - auVar82._8_4_;
    auVar152._12_4_ = auVar151._12_4_ - auVar82._12_4_;
    auVar100._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar100._8_4_ = auVar64._12_4_;
    auVar100._12_4_ = auVar64._12_4_;
    auVar115._0_8_ = CONCAT44(auVar64._8_4_,auVar64._8_4_);
    auVar115._8_4_ = auVar64._12_4_;
    auVar115._12_4_ = auVar64._12_4_;
    auVar125._0_4_ = (uVar136 ^ auVar64._8_4_) - auVar64._8_4_;
    auVar125._4_4_ = (auVar78._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    auVar125._8_4_ = (uVar136 ^ auVar64._8_4_) - auVar64._8_4_;
    auVar125._12_4_ = (auVar78._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    auVar87._0_8_ = (ulong)auVar152._0_4_ * (ulong)auVar125._0_4_;
    auVar87._8_8_ = (auVar152._8_8_ & 0xffffffff) * (ulong)auVar125._8_4_;
    auVar126._0_8_ = (ulong)auVar125._4_4_ * (ulong)auVar152._4_4_;
    auVar126._8_8_ = (auVar125._8_8_ >> 0x20) * (auVar152._8_8_ >> 0x20);
    auVar89._0_4_ = (undefined4)((ulong)(SUB168(auVar87 ^ auVar100,0) - auVar100._0_8_) >> 2);
    auVar88._8_4_ = (undefined4)((ulong)(SUB168(auVar87 ^ auVar100,8) - auVar100._8_8_) >> 2);
    auVar88._4_4_ = auVar88._8_4_;
    auVar88._0_4_ = auVar89._0_4_;
    auVar88._12_4_ =
         (int)((ulong)((SUB168(auVar126 ^ auVar115,8) - auVar115._8_8_) * 0x40000000) >> 0x20);
    auVar89._8_8_ = auVar88._8_8_;
    auVar89._4_4_ =
         (int)((ulong)((SUB168(auVar126 ^ auVar115,0) - auVar115._0_8_) * 0x40000000) >> 0x20);
    auVar89 = auVar89 ^ auVar82;
    iVar96 = auVar89._0_4_ - auVar82._0_4_;
    iVar102 = auVar89._4_4_ - auVar82._4_4_;
    iVar103 = auVar89._8_4_ - auVar82._8_4_;
    iVar104 = auVar89._12_4_ - auVar82._12_4_;
    *dqcoeff_ptr = auVar67._0_4_ - auVar81._0_4_;
    dqcoeff_ptr[1] = auVar67._4_4_ - auVar81._4_4_;
    dqcoeff_ptr[2] = auVar67._8_4_ - auVar81._8_4_;
    dqcoeff_ptr[3] = auVar67._12_4_ - auVar81._12_4_;
  }
  local_178._2_2_ = (ushort)(-1 < (short)local_178._2_2_) * local_178._2_2_;
  local_178._0_2_ = (ushort)(-1 < (short)local_178._0_2_) * local_178._0_2_;
  local_178._4_2_ = (ushort)(-1 < (short)local_178._4_2_) * local_178._4_2_;
  local_178._6_2_ = (ushort)(-1 < (short)local_178._6_2_) * local_178._6_2_;
  local_178._8_2_ = (ushort)(-1 < (short)local_178._8_2_) * local_178._8_2_;
  local_178._10_2_ = (ushort)(-1 < (short)local_178._10_2_) * local_178._10_2_;
  local_178._12_2_ = (ushort)(-1 < (short)local_178._12_2_) * local_178._12_2_;
  local_178._14_2_ = (ushort)(-1 < (short)local_178._14_2_) * local_178._14_2_;
  uVar45 = (ushort)(-1 < auVar47._0_2_) * auVar47._0_2_;
  uVar49 = (ushort)(-1 < auVar47._2_2_) * auVar47._2_2_;
  uVar50 = (ushort)(-1 < auVar47._4_2_) * auVar47._4_2_;
  uVar52 = (ushort)(-1 < auVar47._6_2_) * auVar47._6_2_;
  uVar53 = (ushort)(-1 < auVar47._8_2_) * auVar47._8_2_;
  uVar55 = (ushort)(-1 < auVar47._10_2_) * auVar47._10_2_;
  uVar56 = (ushort)(-1 < auVar47._12_2_) * auVar47._12_2_;
  uVar58 = (ushort)(-1 < auVar47._14_2_) * auVar47._14_2_;
  dqcoeff_ptr[4] = iVar96;
  dqcoeff_ptr[5] = iVar102;
  dqcoeff_ptr[6] = iVar103;
  dqcoeff_ptr[7] = iVar104;
  if (8 < n_coeffs) {
    uVar159 = (uVar145 ^ auVar106._8_4_) - auVar106._8_4_;
    uVar164 = (auVar61._12_4_ ^ auVar106._12_4_) - auVar106._12_4_;
    uVar145 = (uVar145 ^ auVar106._8_4_) - auVar106._8_4_;
    uVar167 = (auVar61._12_4_ ^ auVar106._12_4_) - auVar106._12_4_;
    uVar85 = (uVar147 ^ auVar108._8_4_) - auVar108._8_4_;
    uVar93 = (auVar130._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    uVar94 = (uVar147 ^ auVar108._8_4_) - auVar108._8_4_;
    uVar95 = (auVar130._12_4_ ^ auVar108._12_4_) - auVar108._12_4_;
    uVar46 = (uVar136 ^ auVar64._8_4_) - auVar64._8_4_;
    uVar51 = (auVar78._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    uVar54 = (uVar136 ^ auVar64._8_4_) - auVar64._8_4_;
    uVar57 = (auVar78._12_4_ ^ auVar64._12_4_) - auVar64._12_4_;
    lVar42 = 8;
    uVar40 = CONCAT44(auVar106._8_4_,auVar106._8_4_);
    uVar31 = CONCAT44(auVar106._12_4_,auVar106._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar42);
      puVar2 = (uint *)(coeff_ptr + lVar42 + 4);
      uVar139 = (int)*puVar1 >> 0x1f;
      uVar144 = (int)puVar1[1] >> 0x1f;
      uVar146 = (int)puVar1[2] >> 0x1f;
      uVar148 = (int)puVar1[3] >> 0x1f;
      uVar147 = (int)*puVar2 >> 0x1f;
      uVar136 = (int)puVar2[1] >> 0x1f;
      uVar137 = (int)puVar2[2] >> 0x1f;
      uVar138 = (int)puVar2[3] >> 0x1f;
      iVar96 = (*puVar1 ^ uVar139) - uVar139;
      iVar102 = (puVar1[1] ^ uVar144) - uVar144;
      iVar103 = (puVar1[2] ^ uVar146) - uVar146;
      iVar104 = (puVar1[3] ^ uVar148) - uVar148;
      iVar153 = (*puVar2 ^ uVar147) - uVar147;
      iVar156 = (puVar2[1] ^ uVar136) - uVar136;
      iVar157 = (puVar2[2] ^ uVar137) - uVar137;
      iVar158 = (puVar2[3] ^ uVar138) - uVar138;
      auVar47._0_4_ = -(uint)(aiStack_164[0] < iVar96 * 0x20);
      auVar47._4_4_ = -(uint)(aiStack_164[0] < iVar102 * 0x20);
      auVar47._8_4_ = -(uint)(aiStack_164[0] < iVar103 * 0x20);
      auVar47._12_4_ = -(uint)(aiStack_164[0] < iVar104 * 0x20);
      auVar101._0_4_ = -(uint)(aiStack_164[0] < iVar153 * 0x20);
      auVar101._4_4_ = -(uint)(aiStack_164[0] < iVar156 * 0x20);
      auVar101._8_4_ = -(uint)(aiStack_164[0] < iVar157 * 0x20);
      auVar101._12_4_ = -(uint)(aiStack_164[0] < iVar158 * 0x20);
      auVar47 = packssdw(auVar47,auVar101);
      auVar76 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar47 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar47 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar47[0xf] < '\0'
         ) {
        auVar76 = auVar47 & *(undefined1 (*) [16])(iscan + lVar42);
        bVar37 = true;
      }
      auVar116._0_4_ = -(uint)(iVar149 < iVar96);
      auVar116._4_4_ = -(uint)(iVar150 < iVar102);
      auVar116._8_4_ = -(uint)(iVar149 < iVar103);
      auVar116._12_4_ = -(uint)(iVar150 < iVar104);
      auVar83._0_4_ = -(uint)(iVar149 < iVar153);
      auVar83._4_4_ = -(uint)(iVar150 < iVar156);
      auVar83._8_4_ = -(uint)(iVar149 < iVar157);
      auVar83._12_4_ = -(uint)(iVar150 < iVar158);
      auVar47 = packssdw(auVar116,auVar83);
      uVar59 = (ushort)(SUB161(auVar47 >> 7,0) & 1) | (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf;
      if (uVar59 == 0) {
        auVar47 = (undefined1  [16])0x0;
      }
      else {
        auVar47 = auVar47 & *(undefined1 (*) [16])(iscan + lVar42);
        bVar38 = true;
      }
      iVar39 = movmskps((uint)uVar59,auVar83 | auVar116);
      if (iVar39 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar42) = (undefined1  [16])0x0;
      }
      else {
        auVar127._0_4_ = iVar96 + uVar165;
        auVar127._4_4_ = iVar102 + uVar166;
        auVar127._8_4_ = iVar103 + uVar165;
        auVar127._12_4_ = iVar104 + uVar166;
        uVar29 = CONCAT44(auVar106._8_4_,auVar106._8_4_);
        uVar30 = CONCAT44(auVar106._12_4_,auVar106._12_4_);
        auVar68._0_4_ =
             (int)(((ulong)auVar127._0_4_ * (ulong)uVar159 ^ uVar40) - uVar40 >> 0x10) +
             auVar127._0_4_;
        auVar68._4_4_ =
             (int)(((ulong)auVar127._4_4_ * (ulong)uVar164 ^ uVar29) - uVar29 >> 0x10) +
             auVar127._4_4_;
        auVar68._8_4_ =
             (int)(((auVar127._8_8_ & 0xffffffff) * (ulong)uVar145 ^ uVar31) - uVar31 >> 0x10) +
             auVar127._8_4_;
        auVar68._12_4_ =
             (int)(((auVar127._8_8_ >> 0x20) * (ulong)uVar167 ^ uVar30) - uVar30 >> 0x10) +
             auVar127._12_4_;
        uVar27 = CONCAT44(auVar108._8_4_,auVar108._8_4_);
        uVar28 = CONCAT44(auVar108._12_4_,auVar108._12_4_);
        uVar25 = CONCAT44(auVar108._8_4_,auVar108._8_4_);
        uVar26 = CONCAT44(auVar108._12_4_,auVar108._12_4_);
        auVar163._0_4_ = iVar153 + uVar165;
        auVar163._4_4_ = iVar156 + uVar166;
        auVar163._8_4_ = iVar157 + uVar165;
        auVar163._12_4_ = iVar158 + uVar166;
        auVar69._0_4_ =
             (int)(((ulong)auVar163._0_4_ * (ulong)uVar159 ^ uVar40) - uVar40 >> 0x10) +
             auVar163._0_4_;
        auVar69._4_4_ =
             (int)(((ulong)auVar163._4_4_ * (ulong)uVar164 ^ uVar29) - uVar29 >> 0x10) +
             auVar163._4_4_;
        auVar69._8_4_ =
             (int)(((auVar163._8_8_ & 0xffffffff) * (ulong)uVar145 ^ uVar31) - uVar31 >> 0x10) +
             auVar163._8_4_;
        auVar69._12_4_ =
             (int)(((auVar163._8_8_ >> 0x20) * (ulong)uVar167 ^ uVar30) - uVar30 >> 0x10) +
             auVar163._12_4_;
        auVar90._0_4_ =
             ((uint)(((ulong)auVar68._0_4_ * (ulong)uVar85 ^ uVar27) - uVar27 >> 0xe) ^ uVar139) -
             uVar139;
        auVar90._4_4_ =
             ((uint)((((ulong)auVar68._4_4_ * (ulong)uVar93 ^ uVar25) - uVar25) * 0x40000 >> 0x20) ^
             uVar144) - uVar144;
        auVar90._8_4_ =
             ((uint)(((auVar68._8_8_ & 0xffffffff) * (ulong)uVar94 ^ uVar28) - uVar28 >> 0xe) ^
             uVar146) - uVar146;
        auVar90._12_4_ =
             ((uint)((((auVar68._8_8_ >> 0x20) * (ulong)uVar95 ^ uVar26) - uVar26) * 0x40000 >> 0x20
                    ) ^ uVar148) - uVar148;
        auVar128._0_4_ =
             ((uint)(((ulong)auVar69._0_4_ * (ulong)uVar85 ^ uVar27) - uVar27 >> 0xe) ^ uVar147) -
             uVar147;
        auVar128._4_4_ =
             ((uint)((((ulong)auVar69._4_4_ * (ulong)uVar93 ^ uVar25) - uVar25) * 0x40000 >> 0x20) ^
             uVar136) - uVar136;
        auVar128._8_4_ =
             ((uint)(((auVar69._8_8_ & 0xffffffff) * (ulong)uVar94 ^ uVar28) - uVar28 >> 0xe) ^
             uVar137) - uVar137;
        auVar128._12_4_ =
             ((uint)((((auVar69._8_8_ >> 0x20) * (ulong)uVar95 ^ uVar26) - uVar26) * 0x40000 >> 0x20
                    ) ^ uVar138) - uVar138;
        auVar116 = auVar116 & auVar90;
        auVar83 = auVar83 & auVar128;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42) = auVar116;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar42 + 4) = auVar83;
        auVar91._0_4_ = auVar116._0_4_ >> 0x1f;
        auVar91._4_4_ = auVar116._4_4_ >> 0x1f;
        auVar91._8_4_ = auVar116._8_4_ >> 0x1f;
        auVar91._12_4_ = auVar116._12_4_ >> 0x1f;
        auVar116 = auVar116 ^ auVar91;
        auVar117._0_4_ = auVar116._0_4_ - auVar91._0_4_;
        auVar117._4_4_ = auVar116._4_4_ - auVar91._4_4_;
        auVar117._8_4_ = auVar116._8_4_ - auVar91._8_4_;
        auVar117._12_4_ = auVar116._12_4_ - auVar91._12_4_;
        uVar27 = CONCAT44(auVar64._8_4_,auVar64._8_4_);
        uVar28 = CONCAT44(auVar64._12_4_,auVar64._12_4_);
        uVar25 = CONCAT44(auVar64._8_4_,auVar64._8_4_);
        uVar26 = CONCAT44(auVar64._12_4_,auVar64._12_4_);
        auVar71._0_4_ = (undefined4)(((ulong)auVar117._0_4_ * (ulong)uVar46 ^ uVar27) - uVar27 >> 2)
        ;
        auVar70._8_4_ =
             (undefined4)(((auVar117._8_8_ & 0xffffffff) * (ulong)uVar54 ^ uVar28) - uVar28 >> 2);
        auVar70._4_4_ = auVar70._8_4_;
        auVar70._0_4_ = auVar71._0_4_;
        auVar70._12_4_ =
             (int)((((auVar117._8_8_ >> 0x20) * (ulong)uVar57 ^ uVar26) - uVar26) * 0x40000000 >>
                  0x20);
        auVar71._8_8_ = auVar70._8_8_;
        auVar71._4_4_ =
             (int)((((ulong)auVar117._4_4_ * (ulong)uVar51 ^ uVar25) - uVar25) * 0x40000000 >> 0x20)
        ;
        auVar71 = auVar71 ^ auVar91;
        auVar92._0_4_ = auVar83._0_4_ >> 0x1f;
        auVar92._4_4_ = auVar83._4_4_ >> 0x1f;
        auVar92._8_4_ = auVar83._8_4_ >> 0x1f;
        auVar92._12_4_ = auVar83._12_4_ >> 0x1f;
        auVar83 = auVar83 ^ auVar92;
        auVar84._0_4_ = auVar83._0_4_ - auVar92._0_4_;
        auVar84._4_4_ = auVar83._4_4_ - auVar92._4_4_;
        auVar84._8_4_ = auVar83._8_4_ - auVar92._8_4_;
        auVar84._12_4_ = auVar83._12_4_ - auVar92._12_4_;
        auVar119._0_4_ = (undefined4)(((ulong)auVar84._0_4_ * (ulong)uVar46 ^ uVar27) - uVar27 >> 2)
        ;
        auVar118._8_4_ =
             (undefined4)(((auVar84._8_8_ & 0xffffffff) * (ulong)uVar54 ^ uVar28) - uVar28 >> 2);
        auVar118._4_4_ = auVar118._8_4_;
        auVar118._0_4_ = auVar119._0_4_;
        auVar118._12_4_ =
             (int)((((auVar84._8_8_ >> 0x20) * (ulong)uVar57 ^ uVar26) - uVar26) * 0x40000000 >>
                  0x20);
        auVar119._8_8_ = auVar118._8_8_;
        auVar119._4_4_ =
             (int)((((ulong)auVar84._4_4_ * (ulong)uVar51 ^ uVar25) - uVar25) * 0x40000000 >> 0x20);
        auVar119 = auVar119 ^ auVar92;
        piVar43 = dqcoeff_ptr + lVar42;
        *piVar43 = auVar71._0_4_ - auVar91._0_4_;
        piVar43[1] = auVar71._4_4_ - auVar91._4_4_;
        piVar43[2] = auVar71._8_4_ - auVar91._8_4_;
        piVar43[3] = auVar71._12_4_ - auVar91._12_4_;
        piVar43 = dqcoeff_ptr + lVar42 + 4;
        *piVar43 = auVar119._0_4_ - auVar92._0_4_;
        piVar43[1] = auVar119._4_4_ - auVar92._4_4_;
        piVar43[2] = auVar119._8_4_ - auVar92._8_4_;
        piVar43[3] = auVar119._12_4_ - auVar92._12_4_;
      }
      sVar3 = auVar76._0_2_;
      sVar4 = auVar76._2_2_;
      sVar5 = auVar76._4_2_;
      sVar6 = auVar76._6_2_;
      sVar7 = auVar76._8_2_;
      sVar8 = auVar76._10_2_;
      sVar9 = auVar76._12_2_;
      sVar10 = auVar76._14_2_;
      local_178._2_2_ =
           (ushort)((short)local_178._2_2_ < sVar4) * sVar4 |
           (ushort)((short)local_178._2_2_ >= sVar4) * local_178._2_2_;
      local_178._0_2_ =
           (ushort)((short)local_178._0_2_ < sVar3) * sVar3 |
           (ushort)((short)local_178._0_2_ >= sVar3) * local_178._0_2_;
      local_178._4_2_ =
           (ushort)((short)local_178._4_2_ < sVar5) * sVar5 |
           (ushort)((short)local_178._4_2_ >= sVar5) * local_178._4_2_;
      local_178._6_2_ =
           (ushort)((short)local_178._6_2_ < sVar6) * sVar6 |
           (ushort)((short)local_178._6_2_ >= sVar6) * local_178._6_2_;
      local_178._8_2_ =
           (ushort)((short)local_178._8_2_ < sVar7) * sVar7 |
           (ushort)((short)local_178._8_2_ >= sVar7) * local_178._8_2_;
      local_178._10_2_ =
           (ushort)((short)local_178._10_2_ < sVar8) * sVar8 |
           (ushort)((short)local_178._10_2_ >= sVar8) * local_178._10_2_;
      local_178._12_2_ =
           (ushort)((short)local_178._12_2_ < sVar9) * sVar9 |
           (ushort)((short)local_178._12_2_ >= sVar9) * local_178._12_2_;
      local_178._14_2_ =
           (ushort)((short)local_178._14_2_ < sVar10) * sVar10 |
           (ushort)((short)local_178._14_2_ >= sVar10) * local_178._14_2_;
      sVar3 = auVar47._0_2_;
      uVar45 = (ushort)((short)uVar45 < sVar3) * sVar3 | ((short)uVar45 >= sVar3) * uVar45;
      sVar3 = auVar47._2_2_;
      uVar49 = (ushort)((short)uVar49 < sVar3) * sVar3 | ((short)uVar49 >= sVar3) * uVar49;
      sVar3 = auVar47._4_2_;
      uVar50 = (ushort)((short)uVar50 < sVar3) * sVar3 | ((short)uVar50 >= sVar3) * uVar50;
      sVar3 = auVar47._6_2_;
      uVar52 = (ushort)((short)uVar52 < sVar3) * sVar3 | ((short)uVar52 >= sVar3) * uVar52;
      sVar3 = auVar47._8_2_;
      uVar53 = (ushort)((short)uVar53 < sVar3) * sVar3 | ((short)uVar53 >= sVar3) * uVar53;
      sVar3 = auVar47._10_2_;
      uVar55 = (ushort)((short)uVar55 < sVar3) * sVar3 | ((short)uVar55 >= sVar3) * uVar55;
      sVar3 = auVar47._12_2_;
      uVar56 = (ushort)((short)uVar56 < sVar3) * sVar3 | ((short)uVar56 >= sVar3) * uVar56;
      sVar3 = auVar47._14_2_;
      uVar58 = (ushort)((short)uVar58 < sVar3) * sVar3 | ((short)uVar58 >= sVar3) * uVar58;
      lVar42 = lVar42 + 8;
    } while (lVar42 < n_coeffs);
  }
  if (bVar37) {
    uVar59 = (ushort)((short)local_178._8_2_ < (short)local_178._0_2_) * local_178._0_2_ |
             (ushort)((short)local_178._8_2_ >= (short)local_178._0_2_) * local_178._8_2_;
    uVar72 = (ushort)((short)local_178._10_2_ < (short)local_178._2_2_) * local_178._2_2_ |
             (ushort)((short)local_178._10_2_ >= (short)local_178._2_2_) * local_178._10_2_;
    uVar73 = (ushort)((short)local_178._12_2_ < (short)local_178._4_2_) * local_178._4_2_ |
             (ushort)((short)local_178._12_2_ >= (short)local_178._4_2_) * local_178._12_2_;
    uVar74 = (ushort)((short)local_178._14_2_ < (short)local_178._6_2_) * local_178._6_2_ |
             (ushort)((short)local_178._14_2_ >= (short)local_178._6_2_) * local_178._14_2_;
    uVar59 = ((short)uVar73 < (short)uVar59) * uVar59 | ((short)uVar73 >= (short)uVar59) * uVar73;
    uVar72 = ((short)uVar74 < (short)uVar72) * uVar72 | ((short)uVar74 >= (short)uVar72) * uVar74;
    uVar46 = (ushort)(((short)uVar72 < (short)uVar59) * uVar59 |
                     ((short)uVar72 >= (short)uVar59) * uVar72) + 1;
  }
  else {
    uVar46 = 0;
  }
  if (bVar38) {
    uVar53 = ((short)uVar53 < (short)uVar45) * uVar45 | ((short)uVar53 >= (short)uVar45) * uVar53;
    uVar55 = ((short)uVar55 < (short)uVar49) * uVar49 | ((short)uVar55 >= (short)uVar49) * uVar55;
    uVar49 = ((short)uVar56 < (short)uVar50) * uVar50 | ((short)uVar56 >= (short)uVar50) * uVar56;
    uVar50 = ((short)uVar58 < (short)uVar52) * uVar52 | ((short)uVar58 >= (short)uVar52) * uVar58;
    uVar49 = ((short)uVar49 < (short)uVar53) * uVar53 | ((short)uVar49 >= (short)uVar53) * uVar49;
    uVar50 = ((short)uVar50 < (short)uVar55) * uVar55 | ((short)uVar50 >= (short)uVar55) * uVar50;
    uVar51 = (uint)(ushort)(((short)uVar50 < (short)uVar49) * uVar49 |
                           ((short)uVar50 >= (short)uVar49) * uVar50);
  }
  else {
    uVar51 = 0xffffffff;
  }
  if ((int)uVar46 <= (int)uVar51) {
    iVar96 = uVar51 + 1;
    psVar41 = scan + uVar51;
    do {
      sVar3 = *psVar41;
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      iVar96 = iVar96 + -1;
      psVar41 = psVar41 + -1;
    } while ((int)uVar46 < iVar96);
  }
  iVar96 = uVar46 + 1;
  uVar40 = (ulong)uVar46;
  do {
    if ((long)uVar40 < 1) {
      uVar49 = 0;
      break;
    }
    lVar42 = uVar40 - 1;
    uVar40 = uVar40 - 1;
    iVar96 = iVar96 + -1;
    uVar49 = (ushort)iVar96;
  } while (qcoeff_ptr[scan[lVar42]] == 0);
  *eob_ptr = uVar49;
  uVar51 = 0xffffffff;
  if (uVar46 != 0) {
    uVar40 = 0;
    do {
      if (qcoeff_ptr[scan[uVar40]] != 0) {
        uVar51 = (uint)uVar40;
        break;
      }
      uVar40 = uVar40 + 1;
    } while (uVar46 != uVar40);
  }
  if ((uVar49 != 0) && (uVar51 == uVar49 - 1)) {
    sVar3 = scan[uVar51];
    if (((qcoeff_ptr[sVar3] == 1) || (qcoeff_ptr[sVar3] == -1)) &&
       (uVar46 = coeff_ptr[sVar3] >> 0x1f,
       (int)((coeff_ptr[sVar3] << 5 ^ uVar46) - uVar46) <
       *(int *)((long)&local_150 + (ulong)(sVar3 != 0) * 4) * 0x20 +
       (dequant_ptr[sVar3 != 0] * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_64x64_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 2;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  const __m128i log_scale_vec = _mm_set1_epi32(log_scale);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbins[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);

  // Shift with rounding.
  zbin = _mm_add_epi32(zbin, log_scale_vec);
  round = _mm_add_epi32(round, log_scale_vec);
  zbin = _mm_srli_epi32(zbin, log_scale);
  round = _mm_srli_epi32(round, log_scale);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}